

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> __thiscall
wabt::MakeUnique<wabt::InvokeAction,wabt::Location&>(wabt *this,Location *args)

{
  InvokeAction *this_00;
  Location *args_local;
  
  this_00 = (InvokeAction *)operator_new(0xb0);
  InvokeAction::InvokeAction(this_00,args);
  std::unique_ptr<wabt::InvokeAction,std::default_delete<wabt::InvokeAction>>::
  unique_ptr<std::default_delete<wabt::InvokeAction>,void>
            ((unique_ptr<wabt::InvokeAction,std::default_delete<wabt::InvokeAction>> *)this,this_00)
  ;
  return (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}